

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::reset_discard_counter
          (mpmc_blocking_queue<spdlog::details::async_msg> *this)

{
  long in_RDI;
  memory_order __b;
  
  CLI::std::operator&(relaxed,__memory_order_mask);
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  return;
}

Assistant:

void reset_discard_counter() { discard_counter_.store(0, std::memory_order_relaxed); }